

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_boolean_abi_cxx11_
          (result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  const_iterator rollback;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  value_type *pvVar9;
  internal_error *this_00;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  value_type reg;
  result<toml::detail::region,_toml::detail::none_t> token;
  allocator_type local_249;
  undefined1 local_248 [8];
  undefined1 local_240 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [32];
  string local_1b8;
  pointer local_198;
  undefined1 local_190 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  region local_148;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  undefined1 local_e8 [80];
  bool local_98 [8];
  region local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  rollback._M_current = *(char **)(this + 0x40);
  either<toml::detail::sequence<toml::detail::character<'t'>,_toml::detail::character<'r'>,_toml::detail::character<'u'>,_toml::detail::character<'e'>_>,_toml::detail::sequence<toml::detail::character<'f'>,_toml::detail::character<'a'>,_toml::detail::character<'l'>,_toml::detail::character<'s'>,_toml::detail::character<'e'>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_98,(location *)this);
  if (local_98[0] == true) {
    pvVar9 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)local_98);
    region::region(&local_148,pvVar9);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)local_248,(detail *)local_148.first_._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               local_148.last_._M_current,in_RCX);
    iVar8 = std::__cxx11::string::compare(local_248);
    if ((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]) != local_240 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]),local_240._8_8_ + 1);
    }
    if (iVar8 == 0) {
      local_198 = (pointer)CONCAT71(local_198._1_7_,1);
      region::region((region *)local_190,&local_148);
    }
    else {
      make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                ((string *)local_248,(detail *)local_148.first_._M_current,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 local_148.last_._M_current,in_RCX);
      iVar8 = std::__cxx11::string::compare(local_248);
      if ((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]) != local_240 + 8) {
        operator_delete((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]),local_240._8_8_ + 1);
      }
      if (iVar8 != 0) {
        this_00 = (internal_error *)__cxa_allocate_exception(0x78);
        local_1d8._0_8_ = local_1d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"toml::parse_boolean: internal error","");
        source_location::source_location((source_location *)&local_198,&local_148);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[14],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_248,(source_location *)&local_198,(char (*) [14])0x195614);
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_248;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_100,__l_00,&local_249);
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_1b8,(string *)local_1d8,&local_100,&local_48,false);
        source_location::source_location((source_location *)local_e8,&local_148);
        internal_error::internal_error(this_00,&local_1b8,(source_location *)local_e8);
        __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
      }
      local_198 = (pointer)((ulong)local_198 & 0xffffffffffffff00);
      region::region((region *)local_190,&local_148);
    }
    uVar7 = local_190._32_8_;
    uVar6 = local_190._16_8_;
    uVar5 = local_190._8_8_;
    local_248[0] = local_198._0_1_;
    local_240._0_8_ = &PTR__region_001d9f68;
    local_190._8_8_ = (element_type *)0x0;
    local_190._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._24_8_ == &local_168) {
      local_218._8_8_ = local_168._8_8_;
      local_240._24_8_ = &local_218;
    }
    else {
      local_240._24_8_ = local_190._24_8_;
    }
    local_218._M_allocated_capacity._1_7_ = local_168._M_allocated_capacity._1_7_;
    local_218._M_local_buf[0] = local_168._M_local_buf[0];
    local_190._32_8_ = 0;
    local_168._M_local_buf[0] = '\0';
    local_208._M_allocated_capacity = local_158._M_allocated_capacity;
    local_208._8_8_ = local_158._8_8_;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value.first = local_198._0_1_;
    (__return_storage_ptr__->field_1).fail.value._M_string_length = (size_type)&PTR__region_001d9f68
    ;
    (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = uVar5;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) = 0;
    local_240._16_8_ = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) = uVar6;
    local_240._8_8_ = 0;
    psVar2 = (size_type *)((long)&__return_storage_ptr__->field_1 + 0x30);
    *(size_type **)((long)&__return_storage_ptr__->field_1 + 0x20) = psVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._24_8_ == &local_218) {
      *psVar2 = local_218._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_218._8_8_;
    }
    else {
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_240._24_8_;
      *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x30) =
           local_218._M_allocated_capacity;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = uVar7;
    local_240._32_8_ = 0;
    local_218._M_allocated_capacity = (ulong)(uint7)local_168._M_allocated_capacity._1_7_ << 8;
    *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x40) = local_158._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x48) = local_158._8_8_;
    local_240._24_8_ = &local_218;
    local_190._24_8_ = &local_168;
    region::~region((region *)local_240);
    region::~region((region *)local_190);
    region::~region(&local_148);
    if (local_98[0] == true) {
      region::~region(&local_90);
    }
  }
  else {
    location::reset((location *)this,rollback);
    p_Var3 = &local_148.source_.
              super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    local_148.super_region_base._vptr_region_base = (_func_int **)p_Var3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"toml::parse_boolean: ","")
    ;
    source_location::source_location((source_location *)local_98,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[32],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_248,(source_location *)local_98,
               (char (*) [32])"the next token is not a boolean");
    __l._M_len = 1;
    __l._M_array = (iterator)local_248;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1b8,__l,(allocator_type *)&local_100);
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = (pointer)0x0;
    local_1d8._16_8_ = (pointer)0x0;
    format_underline((string *)local_e8,(string *)&local_148,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_1b8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d8,false);
    pcVar4 = local_190 + 8;
    if ((undefined1 *)local_e8._0_8_ == local_e8 + 0x10) {
      local_190._16_8_ = local_e8._24_8_;
      local_198 = pcVar4;
    }
    else {
      local_198 = (pointer)local_e8._0_8_;
    }
    local_190._9_7_ = local_e8._17_7_;
    local_190[8] = local_e8[0x10];
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if (local_198 == pcVar4) {
      paVar1->_M_allocated_capacity = local_190._8_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) =
           local_190._16_8_;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = local_198;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_190._8_8_;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = local_e8._8_8_;
    local_190._8_8_ = (ulong)(uint7)local_e8._17_7_ << 8;
    local_e8[0x10] = '\0';
    local_e8._8_8_ = 0;
    local_190._0_8_ = (_func_int **)0x0;
    local_198 = pcVar4;
    local_e8._0_8_ = local_e8 + 0x10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_p != &local_1e8) {
      operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_248);
    source_location::~source_location((source_location *)local_98);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_148.super_region_base._vptr_region_base
        != p_Var3) {
      operator_delete(local_148.super_region_base._vptr_region_base,
                      (ulong)((long)&(local_148.source_.
                                      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<boolean, region>, std::string>
parse_boolean(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_boolean::invoke(loc))
    {
        const auto reg = token.unwrap();
        if     (reg.str() == "true")  {return ok(std::make_pair(true,  reg));}
        else if(reg.str() == "false") {return ok(std::make_pair(false, reg));}
        else // internal error.
        {
            throw internal_error(format_underline(
                "toml::parse_boolean: internal error",
                {{source_location(reg), "invalid token"}}),
                source_location(reg));
        }
    }
    loc.reset(first); //rollback
    return err(format_underline("toml::parse_boolean: ",
               {{source_location(loc), "the next token is not a boolean"}}));
}